

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  size_type sVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  cmGeneratorTarget *this_01;
  ostream *poVar6;
  string *o;
  _Alloc_hider _Var7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string reason;
  char *loc;
  string tgtName;
  char *imp;
  ostringstream e;
  allocator<char> local_239;
  string local_238;
  string local_210;
  string local_1f0;
  string local_1d0;
  char *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  std::__cxx11::string::string
            ((string *)&local_1d0,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_1d0);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"Objects of target \"");
    poVar6 = std::operator<<(poVar6,(string *)&local_1d0);
    std::operator<<(poVar6,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_210,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_210,&local_238);
  }
  else {
    TVar4 = cmGeneratorTarget::GetType(this_01);
    if (TVar4 < UTILITY) {
      if (context->EvaluateForBuildsystem == false) {
        pcVar1 = context->LG->GlobalGenerator;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        iVar5 = (*pcVar1->_vptr_cmGlobalGenerator[0x25])(pcVar1,&local_210);
        if ((char)iVar5 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar6 = std::operator<<((ostream *)local_1a8,
                                   "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                  );
          poVar6 = std::operator<<(poVar6,(string *)&local_210);
          std::operator<<(poVar6,").  It is not suitable for writing out elsewhere.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_238,content);
          std::__cxx11::stringbuf::str();
          reportError(context,&local_238,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_238);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::__cxx11::string::~string((string *)&local_210);
          goto LAB_002f4f91;
        }
        std::__cxx11::string::~string((string *)&local_210);
      }
      local_238._M_dataplus._M_p = (pointer)0x0;
      local_238._M_string_length = 0;
      local_238.field_2._M_allocated_capacity = 0;
      bVar3 = cmGeneratorTarget::IsImported(this_01);
      if (bVar3) {
        local_1f0._M_dataplus._M_p = (char *)0x0;
        local_1b0 = (char *)0x0;
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_1a8._8_8_ = 0;
        local_198[0]._M_local_buf[0] = '\0';
        bVar3 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,(char **)&local_1f0,&local_1b0,
                           (string *)local_1a8);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,local_1f0._M_dataplus._M_p,&local_239);
          cmSystemTools::ExpandListArgument
                    (&local_210,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_238,false);
          std::__cxx11::string::~string((string *)&local_210);
        }
        context->HadContextSensitiveCondition = true;
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames
                  (this_01,&context->Config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_1a8._8_8_ = 0;
        local_198[0]._M_local_buf[0] = '\0';
        if (context->EvaluateForBuildsystem == true) {
          std::__cxx11::string::_M_assign((string *)local_1a8);
        }
        else {
          cmGeneratorTarget::GetObjectDirectory(&local_210,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          context->HadContextSensitiveCondition = true;
        }
        sVar2 = local_238._M_string_length;
        for (_Var7._M_p = local_238._M_dataplus._M_p; _Var7._M_p != (pointer)sVar2;
            _Var7._M_p = _Var7._M_p + 0x20) {
          std::operator+(&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var7._M_p);
          std::__cxx11::string::operator=((string *)_Var7._M_p,(string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
        }
      }
      std::__cxx11::string::~string((string *)local_1a8);
      sVar2 = local_238._M_string_length;
      this_00 = context->LG->Makefile;
      for (_Var7._M_p = local_238._M_dataplus._M_p; _Var7._M_p != (pointer)sVar2;
          _Var7._M_p = _Var7._M_p + 0x20) {
        cmMakefile::AddTargetObject(this_00,&local_1d0,(string *)_Var7._M_p);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_238,";");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_238);
      goto LAB_002f4f91;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"Objects of target \"");
    poVar6 = std::operator<<(poVar6,(string *)&local_1d0);
    poVar6 = std::operator<<(poVar6,
                             "\" referenced but is not an allowed library types (EXECUTABLE, ");
    std::operator<<(poVar6,"STATIC, SHARED, MODULE, OBJECT).");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_210,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_210,&local_238);
  }
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_210);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
LAB_002f4f91:
  std::__cxx11::string::~string((string *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not an allowed library types (EXECUTABLE, "
        << "STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    if (!context->EvaluateForBuildsystem) {
      cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
      std::string reason;
      if (!gg->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      const char* loc = nullptr;
      const char* imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, &loc, &imp, suffix)) {
        cmSystemTools::ExpandListArgument(loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        // Here we assume that the set of object files produced
        // by an object library does not vary with configuration
        // and do not set HadContextSensitiveCondition to true.
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::string& o : objects) {
        o = obj_dir + o;
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return cmJoin(objects, ";");
  }